

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O0

void RDL_deleteGraph(RDL_graph *gra)

{
  uint local_14;
  uint i;
  RDL_graph *gra_local;
  
  if (gra != (RDL_graph *)0x0) {
    if (gra->edges != (uint **)0x0) {
      for (local_14 = 0; local_14 < gra->E; local_14 = local_14 + 1) {
        free(gra->edges[local_14]);
      }
      free(gra->edges);
    }
    for (local_14 = 0; local_14 < gra->V; local_14 = local_14 + 1) {
      if (gra->degree[local_14] != 0) {
        free(gra->adjList[local_14]);
      }
    }
    free(gra->adjList);
    free(gra->degree);
    free(gra);
    return;
  }
  __assert_fail("gra != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLgraph.c"
                ,0x78,"void RDL_deleteGraph(RDL_graph *)");
}

Assistant:

void RDL_deleteGraph(RDL_graph *gra)
{
  unsigned i;
  assert(gra != NULL);
  if(gra->edges)
  {
    for(i=0; i<gra->E; ++i)
    {
      free(gra->edges[i]);
    }
    free(gra->edges);
  }
  for(i=0; i<gra->V; ++i)
  {
    if(gra->degree[i] > 0)
    {
      free(gra->adjList[i]);
    }
  }
  free(gra->adjList);
  free(gra->degree);
  free(gra);
}